

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

bool __thiscall tonk::SessionOutgoing::PostDummyDatagram(SessionOutgoing *this)

{
  IUDPSender *pIVar1;
  SenderBandwidthControl *pSVar2;
  bool bVar3;
  uint16_t uVar4;
  uint32_t data;
  uint8_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  SessionOutgoing *in_RDI;
  bool kNotReliable;
  uint kCompressionSavings;
  uint32_t timestamp24;
  uint64_t nowUsec;
  DatagramBuffer datagramBuffer;
  uint sendBytes;
  uint8_t *tagData;
  uint16_t tag;
  uint8_t *timestampData;
  uint taggedBytes;
  uint64_t a;
  uint32_t b;
  NonceT nonce;
  uint nonceBytes;
  uint8_t flags;
  uint8_t *footer;
  uint messageBytes;
  uint8_t *datagramData;
  OutgoingQueuedDatagram *datagram;
  uint headerWord;
  Locker locker;
  LogStringBuffer buffer;
  Lock *in_stack_fffffffffffffb98;
  LogStringBuffer *in_stack_fffffffffffffba0;
  atomic<bool> *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  uint bytes;
  uint8_t *in_stack_fffffffffffffbb8;
  SimpleCipher *in_stack_fffffffffffffbc0;
  SimpleCipher *this_00;
  LogStringBuffer *in_stack_fffffffffffffbd8;
  Allocator *in_stack_fffffffffffffbe0;
  uint64_t in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  Channel *pCVar8;
  uint bytes_00;
  uint8_t *in_stack_fffffffffffffbf8;
  undefined1 *puVar9;
  SimpleCipher *in_stack_fffffffffffffc00;
  DatagramBuffer local_3b0;
  uint local_38c;
  ushort *local_388;
  uint16_t local_37a;
  uint8_t *local_378;
  int local_36c;
  undefined8 local_368;
  undefined4 local_35c;
  NonceT local_358;
  uint local_350;
  byte local_349;
  ushort *local_348;
  uint local_33c;
  uint8_t *local_338;
  uint8_t *local_330;
  bool local_31d;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  uint8_t *local_310;
  undefined4 local_2ec;
  OutgoingQueueCommon *local_2e8;
  uint8_t *local_2e0;
  uint8_t *local_2d8;
  undefined8 local_2d0;
  uint8_t *local_2c8;
  undefined4 local_2bc;
  uint8_t *local_2b8;
  uint32_t local_2ac;
  uint8_t *local_2a8;
  undefined2 local_29a;
  uint8_t *local_298;
  undefined2 local_28a;
  uint8_t *local_288;
  ushort local_27a;
  ushort *local_278;
  byte local_269;
  uint local_268;
  int local_264;
  SenderBandwidthControl *local_260;
  char *local_258;
  Channel *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [392];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  bytes = (uint)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  bytes_00 = (uint)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  bVar3 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffba8);
  if (bVar3) {
    local_2e8 = &in_RDI->super_OutgoingQueueCommon;
    local_2ec = 0x553;
    Locker::Locker((Locker *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    puVar5 = pktalloc::Allocator::Allocate
                       (in_stack_fffffffffffffbe0,(uint)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    Locker::~Locker((Locker *)0x1e3543);
    if (puVar5 == (uint8_t *)0x0) {
      local_31d = false;
    }
    else {
      local_338 = puVar5 + 0x10;
      local_33c = 0x514;
      local_310 = puVar5 + 0x10;
      local_314 = 4;
      local_318 = 0x512;
      local_31c = 0x2512;
      local_28a = 0x2512;
      local_310[0] = '\x12';
      local_310[1] = '%';
      local_330 = puVar5;
      local_288 = local_310;
      memset(puVar5 + 0x12,0,0x512);
      local_348 = (ushort *)(local_338 + local_33c);
      local_349 = 0x80;
      if ((in_RDI->ShouldCompressSequenceNumbers & 1U) != 0) {
        local_349 = 0xa0;
      }
      local_358 = writeNonce(in_RDI,(uint8_t *)local_348,&local_350);
      local_349 = local_349 | (byte)(local_350 << 2);
      local_348 = (ushort *)((long)local_348 + (ulong)local_350);
      bVar3 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffba8);
      if (bVar3) {
        local_349 = local_349 | 0x40;
        local_2e0 = in_RDI->Handshake + 8;
        local_35c = *(undefined4 *)local_2e0;
        local_2d8 = in_RDI->Handshake;
        local_368 = *(undefined8 *)local_2d8;
        local_2c8 = (uint8_t *)local_348;
        *(undefined8 *)local_348 = local_368;
        local_2b8 = (uint8_t *)((long)local_348 + 8);
        *(undefined4 *)local_2b8 = local_35c;
        local_348 = (ushort *)((long)local_348 + 0xc);
        local_2d0 = local_368;
        local_2bc = local_35c;
      }
      local_36c = (int)local_348 - (int)local_338;
      local_378 = (uint8_t *)local_348;
      *(byte *)((long)local_348 + 3) = local_349;
      local_348 = (ushort *)((long)local_348 + 4);
      security::SimpleCipher::Cipher
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,bytes_00,
                 in_stack_fffffffffffffbe8);
      local_37a = security::SimpleCipher::Tag
                            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,bytes,
                             (uint64_t)in_stack_fffffffffffffba8);
      local_388 = local_348;
      local_38c = local_36c + 6;
      DatagramBuffer::DatagramBuffer(&local_3b0);
      local_3b0.AllocatorForFree = &(in_RDI->super_OutgoingQueueCommon).WriteAllocator;
      local_3b0.Data = local_338;
      local_3b0.FreePtr = local_330;
      local_3b0.Bytes = local_38c;
      uVar6 = siamese::GetTimeUsec();
      uVar7 = uVar6 >> 3;
      this_00 = &in_RDI->Encryptor;
      data = protocol::TimestampFlagTagInt((uint32_t)uVar7,local_349);
      uVar4 = security::SimpleCipher::TagInt(this_00,data);
      local_37a = local_37a ^ uVar4;
      local_2a8 = local_378;
      local_378[2] = (uint8_t)(uVar7 >> 0x10);
      local_298 = local_378;
      local_29a = (undefined2)uVar7;
      *(undefined2 *)local_378 = local_29a;
      local_278 = local_388;
      *local_388 = local_37a;
      pIVar1 = (in_RDI->Deps).UDPSender;
      local_2ac = (uint32_t)uVar7;
      local_27a = local_37a;
      (*pIVar1->_vptr_IUDPSender[2])(pIVar1,&in_RDI->PeerUDPAddress,(in_RDI->Deps).ConnectionRef);
      pSVar2 = (in_RDI->Deps).SenderControl;
      local_264 = 0;
      local_268 = local_38c;
      local_269 = 0;
      local_260 = pSVar2;
      std::__atomic_base<int>::operator-=
                (&(pSVar2->AvailableTokens).super___atomic_base<int>,local_38c);
      if ((local_269 & 1) != 0) {
        pSVar2->RecoverySendTokens = pSVar2->RecoverySendTokens + 0x400;
      }
      pSVar2->ProbeSendTokens = local_268 + local_264 + pSVar2->ProbeSendTokens;
      local_31d = true;
    }
  }
  else {
    pCVar8 = (in_RDI->Deps).Logger;
    local_258 = "PostDummyDatagram ignored before peer address is known";
    local_23c = 3;
    local_248 = "PostDummyDatagram ignored before peer address is known";
    local_22c = 3;
    if ((int)pCVar8->ChannelMinLevel < 4) {
      local_7c = 3;
      local_88 = "PostDummyDatagram ignored before peer address is known";
      puVar9 = local_210;
      local_250 = pCVar8;
      local_238 = pCVar8;
      local_228 = pCVar8;
      local_78 = pCVar8;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,Trace);
      local_68 = &pCVar8->Prefix;
      local_70 = local_88;
      local_60 = puVar9;
      local_58 = pCVar8;
      local_50 = local_68;
      local_48 = puVar9;
      local_40 = pCVar8;
      local_38 = local_68;
      local_30 = puVar9;
      std::operator<<((ostream *)(puVar9 + 0x10),(string *)local_68);
      local_20 = local_60;
      local_28 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      local_18 = pCVar8;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e34a4);
    }
    local_31d = false;
  }
  return local_31d;
}

Assistant:

bool SessionOutgoing::PostDummyDatagram()
{
    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostDummyDatagram ignored before peer address is known");
        return false;
    }

    TONK_DEBUG_ASSERT(protocol::kDummyBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + protocol::kDummyBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return false;
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = protocol::kDummyBytes;

    const static unsigned kZeroBytes = protocol::kDummyBytes - protocol::kMessageFrameBytes;
    protocol::WriteMessageFrameHeader(
        datagram->Data,
        protocol::MessageType_Padding,
        kZeroBytes);
    memset(datagram->Data + protocol::kMessageFrameBytes, 0, kZeroBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Write tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_DummyBytesSent] += messageBytes - protocol::kMessageFrameBytes;
    stats->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return true;
}